

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

ClassForm Event::parseClassForm(string *inp)

{
  int iVar1;
  ClassForm CVar2;
  invalid_argument *this;
  
  iVar1 = std::__cxx11::string::compare((char *)inp);
  if (iVar1 == 0) {
    CVar2 = Lecture;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)inp);
    if (iVar1 == 0) {
      CVar2 = Tutorial;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)inp);
      CVar2 = Laboratory;
      if (iVar1 != 0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Invalid class type");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
  }
  return CVar2;
}

Assistant:

static ClassForm parseClassForm(const string &inp) {
        if (inp == "lecture")
            return ClassForm::Lecture;
        else if (inp == "tutorial")
            return ClassForm::Tutorial;
        else if (inp == "laboratory")
            return ClassForm::Laboratory;
        throw invalid_argument("Invalid class type");
    }